

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void fs_emit_error(void)

{
  int *piVar1;
  long *plVar2;
  ostream *poVar3;
  undefined8 extraout_RDX;
  string local_38;
  undefined4 local_18 [2];
  error_condition econd;
  
  piVar1 = __errno_location();
  if (*piVar1 != 0) {
    plVar2 = (long *)std::_V2::generic_category();
    piVar1 = __errno_location();
    local_18[0] = (**(code **)(*plVar2 + 0x28))(plVar2,*piVar1);
    _econd = extraout_RDX;
    poVar3 = std::operator<<((ostream *)&std::cerr,"errno:");
    std::error_condition::message_abi_cxx11_(&local_38,(error_condition *)local_18);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

static void fs_emit_error()
{
#if defined(_WIN32) || defined(__CYGWIN__)
  if (DWORD error = GetLastError(); error)
    std::cerr << "GetLastError:" << std::system_category().message(error) << " ";
#else
  if(errno){
    auto econd = std::generic_category().default_error_condition(errno);
    std::cerr << "errno:" << econd.message() << " ";
  }
#endif
}